

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::MaximumValue(Value *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  byte width;
  uint8_t width_00;
  date_t value;
  idx_t iVar2;
  timestamp_t tVar3;
  timestamp_ms_t timestamp;
  timestamp_sec_t timestamp_00;
  InvalidTypeException *this;
  InternalException *this_00;
  string_t *value_00;
  uint8_t in_R9B;
  hugeint_t hVar4;
  hugeint_t value_01;
  uhugeint_t value_02;
  hugeint_t value_03;
  LogicalType local_80;
  Value local_68;
  
  switch(type->id_) {
  case SQLNULL:
  case INTEGER:
    INTEGER(__return_storage_ptr__,0x7fffffff);
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_0028e39d_caseD_2:
    this = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_68,"MaximumValue requires numeric type",(allocator *)&local_80);
    InvalidTypeException::InvalidTypeException(this,type,(string *)&local_68);
    __cxa_throw(this,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    BOOLEAN(__return_storage_ptr__,true);
    break;
  case TINYINT:
    TINYINT(__return_storage_ptr__,'\x7f');
    break;
  case SMALLINT:
    SMALLINT(__return_storage_ptr__,0x7fff);
    break;
  case BIGINT:
    BIGINT(__return_storage_ptr__,0x7fffffffffffffff);
    break;
  case DATE:
    value = Date::FromDate(0x59beec,7,10);
    DATE(__return_storage_ptr__,value);
    break;
  case TIME:
    TIME(__return_storage_ptr__,(dtime_t)0x141dd76000);
    break;
  case TIMESTAMP_SEC:
    LogicalType::LogicalType(&local_80,TIMESTAMP);
    MaximumValue(&local_68,&local_80);
    tVar3 = GetValueInternal<duckdb::timestamp_t>(&local_68);
    ~Value(&local_68);
    LogicalType::~LogicalType(&local_80);
    timestamp_00 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_sec_t>(tVar3);
    TIMESTAMPSEC(__return_storage_ptr__,timestamp_00);
    break;
  case TIMESTAMP_MS:
    LogicalType::LogicalType(&local_80,TIMESTAMP);
    MaximumValue(&local_68,&local_80);
    tVar3 = GetValueInternal<duckdb::timestamp_t>(&local_68);
    ~Value(&local_68);
    LogicalType::~LogicalType(&local_80);
    timestamp = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_ms_t>(tVar3);
    TIMESTAMPMS(__return_storage_ptr__,timestamp);
    break;
  case TIMESTAMP:
    TIMESTAMP(__return_storage_ptr__,(timestamp_t)0x7ffffffffffffffe);
    break;
  case TIMESTAMP_NS:
    TIMESTAMPNS(__return_storage_ptr__,(timestamp_ns_t)0x7ffffffffffffffe);
    break;
  case DECIMAL:
    width = DecimalType::GetWidth(type);
    width_00 = DecimalType::GetScale(type);
    PVar1 = type->physical_type_;
    if (PVar1 == INT128) {
      hugeint_t::hugeint_t((hugeint_t *)&local_68,1);
      hVar4 = hugeint_t::operator-
                        ((hugeint_t *)(Hugeint::POWERS_OF_TEN + (ulong)width * 0x10),
                         (hugeint_t *)&local_68);
      value_03.lower = hVar4.upper;
      value_03.upper._0_1_ = width;
      value_03.upper._1_7_ = 0;
      DECIMAL(__return_storage_ptr__,(Value *)hVar4.lower,value_03,width_00,in_R9B);
    }
    else if (PVar1 == INT32) {
      DECIMAL(__return_storage_ptr__,*(int *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8) + -1,
              width,width_00);
    }
    else if (PVar1 == INT64) {
      DECIMAL(__return_storage_ptr__,*(long *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8) + -1
              ,width,width_00);
    }
    else {
      if (PVar1 != INT16) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_68,"Unknown decimal type",(allocator *)&local_80);
        InternalException::InternalException(this_00,(string *)&local_68);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      DECIMAL(__return_storage_ptr__,
              (short)*(undefined4 *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8) + -1,width,
              width_00);
    }
    break;
  case FLOAT:
    FLOAT(__return_storage_ptr__,3.4028235e+38);
    break;
  case DOUBLE:
    DOUBLE(__return_storage_ptr__,1.79769313486232e+308);
    break;
  case UTINYINT:
    UTINYINT(__return_storage_ptr__,0xff);
    break;
  case USMALLINT:
    USMALLINT(__return_storage_ptr__,0xffff);
    break;
  case UINTEGER:
    UINTEGER(__return_storage_ptr__,0xffffffff);
    break;
  case UBIGINT:
    UBIGINT(__return_storage_ptr__,0xffffffffffffffff);
    break;
  case TIMESTAMP_TZ:
    TIMESTAMPTZ(__return_storage_ptr__,(timestamp_tz_t)0x7ffffffffffffffe);
    break;
  case TIME_TZ:
    TIMETZ(__return_storage_ptr__,(dtime_tz_t)0x141dd7600001c1fe);
    break;
  case VARINT:
    string_t::string_t((string_t *)&local_80,
                       "179769313486231570814527423731704356798070567525844996598917476803157260780028538760589558632766878171540458953514382464234321326889464182768467546703537516986049910576551282076245490090389328944075868508455133942304583236903222948165808559332123348274797826204144723168738177180919299881250404026184124858368"
                      );
    Varint::VarcharToVarInt_abi_cxx11_((string *)&local_68,(Varint *)&local_80,value_00);
    VARINT(__return_storage_ptr__,(string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    break;
  case UHUGEINT:
    value_02.upper = (uint64_t)&switchD_0028e39d::switchdataD_010086bc;
    value_02.lower = 0xffffffffffffffff;
    UHUGEINT(__return_storage_ptr__,(Value *)0xffffffffffffffff,value_02);
    break;
  case HUGEINT:
    value_01.upper = (int64_t)&switchD_0028e39d::switchdataD_010086bc;
    value_01.lower = 0x7fffffffffffffff;
    HUGEINT(__return_storage_ptr__,(Value *)0xffffffffffffffff,value_01);
    break;
  case UUID:
    hVar4.upper = (int64_t)&switchD_0028e39d::switchdataD_010086bc;
    hVar4.lower = 0x7fffffffffffffff;
    UUID(__return_storage_ptr__,(Value *)0xffffffffffffffff,hVar4);
    break;
  default:
    if (type->id_ != ENUM) goto switchD_0028e39d_caseD_2;
    iVar2 = EnumType::GetSize(type);
    ENUM(__return_storage_ptr__,(iVar2 - 1) + (ulong)(iVar2 == 0),type);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::MaximumValue(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return Value::BOOLEAN(true);
	case LogicalTypeId::TINYINT:
		return Value::TINYINT(NumericLimits<int8_t>::Maximum());
	case LogicalTypeId::SMALLINT:
		return Value::SMALLINT(NumericLimits<int16_t>::Maximum());
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::SQLNULL:
		return Value::INTEGER(NumericLimits<int32_t>::Maximum());
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(NumericLimits<int64_t>::Maximum());
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(NumericLimits<hugeint_t>::Maximum());
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(NumericLimits<uhugeint_t>::Maximum());
	case LogicalTypeId::UUID:
		return Value::UUID(NumericLimits<hugeint_t>::Maximum());
	case LogicalTypeId::UTINYINT:
		return Value::UTINYINT(NumericLimits<uint8_t>::Maximum());
	case LogicalTypeId::USMALLINT:
		return Value::USMALLINT(NumericLimits<uint16_t>::Maximum());
	case LogicalTypeId::UINTEGER:
		return Value::UINTEGER(NumericLimits<uint32_t>::Maximum());
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(NumericLimits<uint64_t>::Maximum());
	case LogicalTypeId::DATE:
		return Value::DATE(Date::FromDate(Date::DATE_MAX_YEAR, Date::DATE_MAX_MONTH, Date::DATE_MAX_DAY));
	case LogicalTypeId::TIME:
		//	24:00:00 according to PG
		return Value::TIME(dtime_t(Interval::MICROS_PER_DAY));
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(timestamp_t(NumericLimits<int64_t>::Maximum() - 1));
	case LogicalTypeId::TIMESTAMP_SEC: {
		// Get the maximum timestamp and cast it to timestamp_s_t.
		const auto max_ts = MaximumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_sec_t>(max_ts);
		return Value::TIMESTAMPSEC(ts);
	}
	case LogicalTypeId::TIMESTAMP_MS: {
		// Get the maximum timestamp and cast it to timestamp_ms_t.
		const auto max_ts = MaximumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_ms_t>(max_ts);
		return Value::TIMESTAMPMS(ts);
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		const auto ts = timestamp_ns_t(NumericLimits<int64_t>::Maximum() - 1);
		return Value::TIMESTAMPNS(ts);
	}
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(timestamp_tz_t(NumericLimits<int64_t>::Maximum() - 1));
	case LogicalTypeId::TIME_TZ:
		// "24:00:00-1559" from the PG docs but actually "24:00:00-15:59:59".
		return Value::TIMETZ(dtime_tz_t(dtime_t(Interval::MICROS_PER_DAY), dtime_tz_t::MIN_OFFSET));
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(NumericLimits<float>::Maximum());
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(NumericLimits<double>::Maximum());
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(int16_t(NumericHelper::POWERS_OF_TEN[width] - 1), width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(int32_t(NumericHelper::POWERS_OF_TEN[width] - 1), width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(int64_t(NumericHelper::POWERS_OF_TEN[width] - 1), width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(Hugeint::POWERS_OF_TEN[width] - 1, width, scale);
		default:
			throw InternalException("Unknown decimal type");
		}
	}
	case LogicalTypeId::ENUM: {
		auto enum_size = EnumType::GetSize(type);
		return Value::ENUM(enum_size - (enum_size ? 1 : 0), type);
	}
	case LogicalTypeId::VARINT:
		return Value::VARINT(Varint::VarcharToVarInt(
		    "1797693134862315708145274237317043567980705675258449965989174768031572607800285387605895586327668781715404"
		    "5895351438246423432132688946418276846754670353751698604991057655128207624549009038932894407586850845513394"
		    "2304583236903222948165808559332123348274797826204144723168738177180919299881250404026184124858368"));
	default:
		throw InvalidTypeException(type, "MaximumValue requires numeric type");
	}
}